

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void upb_Decoder_AddMessageSetItem
               (upb_Decoder *d,upb_Message *msg,upb_MiniTable *t,uint32_t type_id,char *data,
               uint32_t size)

{
  anon_union_56_2_073d5ac0_for_upb_Decoder_8 *arena;
  _Bool _Var1;
  upb_CType uVar2;
  upb_DecodeStatus status;
  upb_MiniTableExtension *e;
  upb_Extension *puVar3;
  upb_Message *msg_00;
  char *pcVar4;
  char *pcVar5;
  upb_MiniTable *mt;
  char local_78 [72];
  
  e = upb_ExtensionRegistry_Lookup(d->extreg,t,type_id);
  if (e == (upb_MiniTableExtension *)0x0) {
    pcVar4 = upb_Decoder_EncodeVarint32(0xb,local_78);
    pcVar4 = upb_Decoder_EncodeVarint32(0x10,pcVar4);
    pcVar4 = upb_Decoder_EncodeVarint32(type_id,pcVar4);
    pcVar4 = upb_Decoder_EncodeVarint32(0x1a,pcVar4);
    pcVar4 = upb_Decoder_EncodeVarint32(size,pcVar4);
    pcVar5 = upb_Decoder_EncodeVarint32(0xc,pcVar4);
    arena = &d->field_8;
    _Var1 = _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
                      (msg,local_78,(long)pcVar4 - (long)local_78,&arena->arena);
    if (((_Var1) &&
        (_Var1 = _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
                           (msg,data,(ulong)size,&arena->arena), _Var1)) &&
       (_Var1 = _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
                          (msg,pcVar4,(long)pcVar5 - (long)pcVar4,&arena->arena), _Var1)) {
      return;
    }
  }
  else {
    puVar3 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only
                       (msg,e,&(d->field_8).arena);
    if (puVar3 != (upb_Extension *)0x0) {
      msg_00 = _upb_Decoder_NewSubMessage2
                         (d,(puVar3->ext->sub_dont_copy_me__upb_internal_use_only).
                            submsg_dont_copy_me__upb_internal_use_only,
                          &puVar3->ext->field_dont_copy_me__upb_internal_use_only,
                          (upb_TaggedMessagePtr *)&(puVar3->data).uint32_val);
      uVar2 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only);
      if (uVar2 == kUpb_CType_Message) {
        mt = (e->sub_dont_copy_me__upb_internal_use_only).submsg_dont_copy_me__upb_internal_use_only
        ;
      }
      else {
        mt = (upb_MiniTable *)0x0;
      }
      status = upb_Decode(data,(ulong)size,msg_00,mt,d->extreg,(uint)d->options,&(d->field_8).arena)
      ;
      if (status == kUpb_DecodeStatus_Ok) {
        return;
      }
      _upb_Decoder_ErrorJmp(d,status);
    }
  }
  _upb_Decoder_ErrorJmp(d,kUpb_DecodeStatus_OutOfMemory);
}

Assistant:

static void upb_Decoder_AddMessageSetItem(upb_Decoder* d, upb_Message* msg,
                                          const upb_MiniTable* t,
                                          uint32_t type_id, const char* data,
                                          uint32_t size) {
  const upb_MiniTableExtension* item_mt =
      upb_ExtensionRegistry_Lookup(d->extreg, t, type_id);
  if (item_mt) {
    upb_Decoder_AddKnownMessageSetItem(d, msg, item_mt, data, size);
  } else {
    upb_Decoder_AddUnknownMessageSetItem(d, msg, type_id, data, size);
  }
}